

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestCase::Run(TestCase *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *this_00;
  OsStackTraceGetterInterface *pOVar2;
  TimeInMillis TVar3;
  TestInfo *this_01;
  TimeInMillis TVar4;
  int i;
  int i_00;
  
  if (this->should_run_ == true) {
    this_00 = internal::GetUnitTestImpl();
    this_00->current_test_case_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
    pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar2->_vptr_OsStackTraceGetterInterface[3])(pOVar2);
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x130dd6,(char *)0x0)
    ;
    TVar3 = internal::GetTimeInMillis();
    for (i_00 = 0;
        i_00 < (int)((ulong)((long)(this->test_info_list_).
                                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->test_info_list_).
                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1)
    {
      this_01 = GetMutableTestInfo(this,i_00);
      TestInfo::Run(this_01);
    }
    TVar4 = internal::GetTimeInMillis();
    this->elapsed_time_ = TVar4 - TVar3;
    pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar2->_vptr_OsStackTraceGetterInterface[3])(pOVar2);
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>(this,0x130dda,(char *)0x0)
    ;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[10])(pTVar1,this);
    this_00->current_test_case_ = (TestCase *)0x0;
  }
  return;
}

Assistant:

void TestCase::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_case(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  repeater->OnTestCaseStart(*this);
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunSetUpTestCase, "SetUpTestCase()");

  const internal::TimeInMillis start = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
  }
  elapsed_time_ = internal::GetTimeInMillis() - start;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunTearDownTestCase, "TearDownTestCase()");

  repeater->OnTestCaseEnd(*this);
  impl->set_current_test_case(NULL);
}